

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O1

_Bool trans_VCVT_int_dp(DisasContext_conflict1 *s,arg_VCVT_int_dp *a)

{
  TCGContext_conflict1 *s_00;
  _Bool _Var1;
  uint uVar2;
  TCGTemp *ts;
  TCGTemp *ret;
  TCGTemp *pTVar3;
  _Bool _Var4;
  uintptr_t o_2;
  code *func;
  uintptr_t o_1;
  TCGTemp *local_48;
  TCGTemp *local_40;
  
  uVar2 = s->isar->mvfr0;
  if (((uVar2 & 0xf00) == 0) ||
     ((s_00 = s->uc->tcg_ctx, (uVar2 & 0xe) == 0 && ((a->vd & 0x10) != 0)))) {
    _Var4 = false;
  }
  else {
    _Var1 = full_vfp_access_check(s,false);
    _Var4 = true;
    if (_Var1) {
      ts = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
      ret = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
      uVar2 = a->vm << 2;
      tcg_gen_op3_aarch64(s_00,INDEX_op_ld_i32,(TCGArg)ts,(TCGArg)(s_00->cpu_env + (long)s_00),
                          (ulong)(uVar2 & 4) + ((ulong)(uVar2 & 8) | (ulong)((uint)a->vm >> 2) << 8)
                          + 0xc10);
      pTVar3 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
      tcg_gen_addi_i64_aarch64
                (s_00,(TCGv_i64)((long)pTVar3 - (long)s_00),(TCGv_i64)s_00->cpu_env,0x2ec8);
      if (a->s == 0) {
        func = helper_vfp_uitod_aarch64;
      }
      else {
        func = helper_vfp_sitod_aarch64;
      }
      local_48 = ts;
      local_40 = pTVar3;
      tcg_gen_callN_aarch64(s_00,func,ret,2,&local_48);
      tcg_gen_op3_aarch64(s_00,INDEX_op_st_i64,(TCGArg)ret,(TCGArg)(s_00->cpu_env + (long)s_00),
                          (ulong)((uint)a->vd >> 1) * 0x100 + (ulong)(a->vd & 1) * 8 + 0xc10);
      tcg_temp_free_internal_aarch64(s_00,ts);
      tcg_temp_free_internal_aarch64(s_00,ret);
      tcg_temp_free_internal_aarch64
                (s_00,(TCGTemp *)((TCGv_i64)((long)pTVar3 - (long)s_00) + (long)s_00));
    }
  }
  return _Var4;
}

Assistant:

static bool trans_VCVT_int_dp(DisasContext *s, arg_VCVT_int_dp *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 vm;
    TCGv_i64 vd;
    TCGv_ptr fpst;

    if (!dc_isar_feature(aa32_fpdp_v2, s)) {
        return false;
    }

    /* UNDEF accesses to D16-D31 if they don't exist. */
    if (!dc_isar_feature(aa32_simd_r32, s) && (a->vd & 0x10)) {
        return false;
    }

    if (!vfp_access_check(s)) {
        return true;
    }

    vm = tcg_temp_new_i32(tcg_ctx);
    vd = tcg_temp_new_i64(tcg_ctx);
    neon_load_reg32(tcg_ctx, vm, a->vm);
    fpst = get_fpstatus_ptr(tcg_ctx, false);
    if (a->s) {
        /* i32 -> f64 */
        gen_helper_vfp_sitod(tcg_ctx, vd, vm, fpst);
    } else {
        /* u32 -> f64 */
        gen_helper_vfp_uitod(tcg_ctx, vd, vm, fpst);
    }
    neon_store_reg64(tcg_ctx, vd, a->vd);
    tcg_temp_free_i32(tcg_ctx, vm);
    tcg_temp_free_i64(tcg_ctx, vd);
    tcg_temp_free_ptr(tcg_ctx, fpst);
    return true;
}